

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

Diagnostics * __thiscall slang::ast::Compilation::getAllDiagnostics(Compilation *this)

{
  optional<slang::Diagnostics> *this_00;
  void *__s;
  Diagnostic *pDVar1;
  Diagnostics *pDVar2;
  
  this_00 = &this->cachedAllDiagnostics;
  if ((this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload
      .super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
      super__Optional_payload_base<slang::Diagnostics>._M_engaged == false) {
    std::_Optional_payload_base<slang::Diagnostics>::_M_reset
              ((_Optional_payload_base<slang::Diagnostics> *)this_00);
    __s = (void *)((long)&(this->cachedAllDiagnostics).
                          super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
                          super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
                          super__Optional_payload_base<slang::Diagnostics>._M_payload + 0x18);
    memset(__s,0,0xe0);
    (this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
    super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
    super__Optional_payload_base<slang::Diagnostics>._M_payload._M_value.
    super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_ = __s;
    *(size_type *)
     ((long)&(this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
             _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
             super__Optional_payload_base<slang::Diagnostics>._M_payload._M_value.
             super_SmallVector<slang::Diagnostic,_2UL> + 8) = 0;
    *(size_type *)
     ((long)&(this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
             _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
             super__Optional_payload_base<slang::Diagnostics>._M_payload._M_value.
             super_SmallVector<slang::Diagnostic,_2UL> + 0x10) = 2;
    (this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
    super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
    super__Optional_payload_base<slang::Diagnostics>._M_engaged = true;
    pDVar2 = getParseDiagnostics(this);
    pDVar1 = (pDVar2->super_SmallVector<slang::Diagnostic,_2UL>).
             super_SmallVectorBase<slang::Diagnostic>.data_;
    SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostic_const*,void>
              ((SmallVectorBase<slang::Diagnostic> *)this_00,pDVar1,
               pDVar1 + (pDVar2->super_SmallVector<slang::Diagnostic,_2UL>).
                        super_SmallVectorBase<slang::Diagnostic>.len);
    pDVar2 = getSemanticDiagnostics(this);
    pDVar1 = (pDVar2->super_SmallVector<slang::Diagnostic,_2UL>).
             super_SmallVectorBase<slang::Diagnostic>.data_;
    SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostic_const*,void>
              ((SmallVectorBase<slang::Diagnostic> *)this_00,pDVar1,
               pDVar1 + (pDVar2->super_SmallVector<slang::Diagnostic,_2UL>).
                        super_SmallVectorBase<slang::Diagnostic>.len);
    if (this->sourceManager != (SourceManager *)0x0) {
      Diagnostics::sort((Diagnostics *)this_00,this->sourceManager);
    }
  }
  return (Diagnostics *)this_00;
}

Assistant:

const Diagnostics& Compilation::getAllDiagnostics() {
    if (cachedAllDiagnostics)
        return *cachedAllDiagnostics;

    cachedAllDiagnostics.emplace();
    cachedAllDiagnostics->append(getParseDiagnostics());
    cachedAllDiagnostics->append(getSemanticDiagnostics());

    if (sourceManager)
        cachedAllDiagnostics->sort(*sourceManager);
    return *cachedAllDiagnostics;
}